

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

void __thiscall
jaegertracing::Span::
logFieldsNoLocking<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
          (Span *this,time_point *timestamp,
          __normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
          first,__normal_iterator<const_jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                last)

{
  LogRecord log;
  LogRecord LStack_28;
  
  LogRecord::
  LogRecord<__gnu_cxx::__normal_iterator<jaegertracing::Tag_const*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
            (&LStack_28,timestamp,first,last);
  std::vector<jaegertracing::LogRecord,_std::allocator<jaegertracing::LogRecord>_>::push_back
            (&this->_logs,&LStack_28);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&LStack_28._fields);
  return;
}

Assistant:

void logFieldsNoLocking(const std::chrono::system_clock::time_point& timestamp, FieldIterator first, FieldIterator last) noexcept
    {
        LogRecord log(timestamp, first, last);
        _logs.push_back(log);
    }